

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O2

uint16_t ans_msb_mapping_and_exceptions(uint32_t x,uint8_t **except_out)

{
  uint8_t *puVar1;
  
  if (0x100 < x) {
    if (0x10000 < x) {
      puVar1 = *except_out;
      *except_out = puVar1 + 1;
      *puVar1 = (uint8_t)x;
      puVar1 = *except_out;
      *except_out = puVar1 + 1;
      *puVar1 = (uint8_t)(x >> 8);
      if (x < 0x1000001) {
        return (ushort)(x >> 0x10) | 0x200;
      }
      puVar1 = *except_out;
      *except_out = puVar1 + 1;
      *puVar1 = (uint8_t)(x >> 0x10);
      return (byte)(x >> 0x18) | 0x300;
    }
    puVar1 = *except_out;
    *except_out = puVar1 + 1;
    *puVar1 = (uint8_t)x;
    x = (x >> 8) + 0x100;
  }
  return (uint16_t)x;
}

Assistant:

uint16_t ans_msb_mapping_and_exceptions(uint32_t x, uint8_t*& except_out)
{
    if (x <= 256) {
        return x;
    }
    if (x <= (1 << 16)) {
        // one exception byte
        *except_out++ = x & 0xFF;
        return (x >> 8) + 256;
    }
    if (x <= (1 << 24)) {
        // two exception byte
        *except_out++ = x & 0xFF;
        *except_out++ = (x >> 8) & 0xFF;
        return (x >> 16) + 512;
    }
    // three exception byte
    *except_out++ = x & 0xFF;
    *except_out++ = (x >> 8) & 0xFF;
    *except_out++ = (x >> 16) & 0xFF;
    return (x >> 24) + 768;
}